

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateExtraDefaultFields
          (MessageGenerator *this,Printer *printer)

{
  Printer *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  CppType CVar4;
  CType CVar5;
  OneofDescriptor *pOVar6;
  FieldGenerator *pFVar7;
  FieldOptions *this_01;
  FieldDescriptor *field_00;
  string local_58;
  FieldDescriptor *local_38;
  FieldDescriptor *field_1;
  FieldDescriptor *pFStack_28;
  int i_1;
  FieldDescriptor *field;
  int j;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  _j = printer;
  printer_local = (Printer *)this;
  iVar2 = Descriptor::oneof_decl_count(this->descriptor_);
  if ((0 < iVar2) || (0 < this->num_weak_fields_)) {
    io::Printer::Print(_j,"public:\n");
    for (field._4_4_ = 0; iVar2 = field._4_4_,
        iVar3 = Descriptor::oneof_decl_count(this->descriptor_), iVar2 < iVar3;
        field._4_4_ = field._4_4_ + 1) {
      field._0_4_ = 0;
      while( true ) {
        iVar2 = (int)field;
        pOVar6 = Descriptor::oneof_decl(this->descriptor_,field._4_4_);
        iVar3 = OneofDescriptor::field_count(pOVar6);
        if (iVar3 <= iVar2) break;
        pOVar6 = Descriptor::oneof_decl(this->descriptor_,field._4_4_);
        pFStack_28 = OneofDescriptor::field(pOVar6,(int)field);
        CVar4 = FieldDescriptor::cpp_type(pFStack_28);
        if ((CVar4 == CPPTYPE_MESSAGE) ||
           ((CVar4 = FieldDescriptor::cpp_type(pFStack_28), CVar4 == CPPTYPE_STRING &&
            (CVar5 = EffectiveStringCType(pFStack_28), CVar5 != FieldOptions_CType_STRING)))) {
          io::Printer::Print(_j,"const ");
        }
        pFVar7 = FieldGeneratorMap::get(&this->field_generators_,pFStack_28);
        (*pFVar7->_vptr_FieldGenerator[2])(pFVar7,_j);
        field._0_4_ = (int)field + 1;
      }
    }
    for (field_1._4_4_ = 0; iVar2 = field_1._4_4_,
        iVar3 = Descriptor::field_count(this->descriptor_), iVar2 < iVar3;
        field_1._4_4_ = field_1._4_4_ + 1) {
      local_38 = Descriptor::field(this->descriptor_,field_1._4_4_);
      this_01 = FieldDescriptor::options(local_38);
      bVar1 = FieldOptions::weak(this_01);
      this_00 = _j;
      if (bVar1) {
        FieldName_abi_cxx11_(&local_58,(cpp *)local_38,field_00);
        io::Printer::Print(this_00,"  const ::google::protobuf::Message* $name$_;\n","name",
                           &local_58);
        std::__cxx11::string::~string((string *)&local_58);
      }
    }
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateExtraDefaultFields(io::Printer* printer) {
  // Generate oneof default instance and weak field instances for reflection
  // usage.
  if (descriptor_->oneof_decl_count() > 0 || num_weak_fields_ > 0) {
    printer->Print("public:\n");
    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
      for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
        const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
        if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
            (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING &&
             EffectiveStringCType(field) != FieldOptions::STRING)) {
          printer->Print("const ");
        }
        field_generators_.get(field).GeneratePrivateMembers(printer);
      }
    }
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (field->options().weak()) {
        printer->Print(
            "  const ::google::protobuf::Message* $name$_;\n", "name", FieldName(field));
      }
    }
  }
}